

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O2

Json __thiscall slack::_detail::CategoryApi::test_abi_cxx11_(CategoryApi *this)

{
  string *method;
  json_value extraout_RDX;
  undefined8 *in_RSI;
  Json JVar1;
  allocator local_52;
  allocator local_51;
  string local_50 [32];
  string local_30;
  
  method = (string *)*in_RSI;
  std::__cxx11::string::string((string *)&local_30,"api.test",&local_51);
  std::__cxx11::string::string(local_50,"",&local_52);
  Slacking::get((Slacking *)this,method,&local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)&local_30);
  JVar1.m_value.object = extraout_RDX.object;
  JVar1._0_8_ = this;
  return JVar1;
}

Assistant:

inline
Json CategoryApi::test() {
    auto json = slack_.get("api.test");
    return json;
}